

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::t_formatter::format(t_formatter *this,log_msg *msg,tm *param_3,memory_buffer *dest)

{
  bool bVar1;
  long in_RDI;
  scoped_pad p;
  uint field_size;
  scoped_pad *in_stack_ffffffffffffffa0;
  memory_buffer *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_pad *in_stack_ffffffffffffffc0;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  unsigned_long in_stack_ffffffffffffffd0;
  
  bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
  if (bVar1) {
    fmt_helper::count_digits<unsigned_long>(0x12b4ae);
    scoped_pad::scoped_pad
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    fmt_helper::append_int<unsigned_long,500ul>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    scoped_pad::~scoped_pad(in_stack_ffffffffffffffa0);
  }
  else {
    fmt_helper::append_int<unsigned_long,500ul>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            const auto field_size = fmt_helper::count_digits(msg.thread_id);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(msg.thread_id, dest);
        }
        else
        {
            fmt_helper::append_int(msg.thread_id, dest);
        }
    }